

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall btRigidBody::setCenterOfMassTransform(btRigidBody *this,btTransform *xform)

{
  bool bVar1;
  btVector3 *pbVar2;
  btTransform *in_RSI;
  btRigidBody *in_RDI;
  btRigidBody *in_stack_00000080;
  
  bVar1 = btCollisionObject::isKinematicObject(&in_RDI->super_btCollisionObject);
  if (bVar1) {
    btTransform::operator=(in_RSI,(btTransform *)in_RDI);
  }
  else {
    btTransform::operator=(in_RSI,(btTransform *)in_RDI);
  }
  pbVar2 = getLinearVelocity(in_RDI);
  *(undefined8 *)(in_RDI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats =
       *(undefined8 *)pbVar2->m_floats;
  *(undefined8 *)((in_RDI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats + 2) =
       *(undefined8 *)(pbVar2->m_floats + 2);
  pbVar2 = getAngularVelocity(in_RDI);
  *(undefined8 *)(in_RDI->super_btCollisionObject).m_interpolationAngularVelocity.m_floats =
       *(undefined8 *)pbVar2->m_floats;
  *(undefined8 *)((in_RDI->super_btCollisionObject).m_interpolationAngularVelocity.m_floats + 2) =
       *(undefined8 *)(pbVar2->m_floats + 2);
  btTransform::operator=(in_RSI,(btTransform *)in_RDI);
  updateInertiaTensor(in_stack_00000080);
  return;
}

Assistant:

void btRigidBody::setCenterOfMassTransform(const btTransform& xform)
{

	if (isKinematicObject())
	{
		m_interpolationWorldTransform = m_worldTransform;
	} else
	{
		m_interpolationWorldTransform = xform;
	}
	m_interpolationLinearVelocity = getLinearVelocity();
	m_interpolationAngularVelocity = getAngularVelocity();
	m_worldTransform = xform;
	updateInertiaTensor();
}